

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O2

void __thiscall icu_63::RuleBasedTimeZone::complete(RuleBasedTimeZone *this,UErrorCode *status)

{
  char *pcVar1;
  Replaceable RVar2;
  Replaceable RVar3;
  UBool UVar4;
  char cVar5;
  int32_t j;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int iVar11;
  UVector *pUVar12;
  void *buffer;
  size_t sVar13;
  TimeZoneRule *pTVar14;
  long *plVar15;
  UVector *pUVar16;
  double *obj;
  UObject this_00;
  UObject this_01;
  UObject *buffer_00;
  void *obj_00;
  UObject UVar17;
  UErrorCode UVar18;
  TimeZoneRule *pTVar19;
  size_t s;
  UObject local_100;
  double local_f8;
  TimeZoneRule *local_e8;
  double local_e0;
  UDate tt;
  UVector **local_c0;
  UObject local_b8;
  UnicodeString curName;
  UnicodeString name;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (this->fUpToDate != '\0') {
    return;
  }
  pUVar16 = this->fFinalRules;
  pTVar19 = (TimeZoneRule *)status;
  if (pUVar16 == (UVector *)0x0) {
    pUVar12 = this->fHistoricRules;
    if (pUVar12 == (UVector *)0x0) {
      this->fUpToDate = '\x01';
      return;
    }
    local_100._vptr_UObject = (_func_int **)this->fInitialRule;
LAB_00202662:
    local_c0 = &this->fHistoricRules;
    s = (size_t)pUVar12->count;
    if (0 < (long)s) {
      buffer = uprv_malloc_63(s);
      if (buffer == (void *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        buffer = (void *)0x0;
      }
      else {
        for (sVar13 = 0; s != sVar13; sVar13 = sVar13 + 1) {
          *(undefined1 *)((long)buffer + sVar13) = 0;
        }
        local_f8 = -1.84303902528e+17;
        local_b8._vptr_UObject = (_func_int **)&PTR__UnicodeString_003e4bf0;
LAB_002026cc:
        uVar6 = TimeZoneRule::getRawOffset((TimeZoneRule *)local_100._vptr_UObject);
        uVar7 = TimeZoneRule::getDSTSavings((TimeZoneRule *)local_100._vptr_UObject);
        pTVar19 = (TimeZoneRule *)&curName;
        curName.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)(UObject)local_b8._vptr_UObject;
        curName.fUnion.fStackFields.fLengthAndFlags = 2;
        name.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)(UObject)local_b8._vptr_UObject;
        name.fUnion.fStackFields.fLengthAndFlags = 2;
        TimeZoneRule::getName((TimeZoneRule *)local_100._vptr_UObject,(UnicodeString *)pTVar19);
        local_e8 = (TimeZoneRule *)0x0;
        local_e0 = 1.838821689216e+17;
        for (sVar13 = 0; s != sVar13; sVar13 = sVar13 + 1) {
          if (*(char *)((long)buffer + sVar13) == '\0') {
            pTVar14 = (TimeZoneRule *)UVector::elementAt(*local_c0,(int32_t)sVar13);
            pTVar19 = (TimeZoneRule *)(ulong)uVar6;
            iVar8 = (*(pTVar14->super_UObject)._vptr_UObject[9])
                              (local_f8,pTVar14,pTVar19,(ulong)uVar7,0,&tt);
            if ((char)iVar8 == '\0') {
              *(undefined1 *)((long)buffer + sVar13) = 1;
            }
            else {
              TimeZoneRule::getName(pTVar14,&name);
              pTVar19 = (TimeZoneRule *)local_100._vptr_UObject;
              iVar8 = (*(pTVar14->super_UObject)._vptr_UObject[4])(pTVar14);
              if ((char)iVar8 == '\0') {
                pTVar19 = (TimeZoneRule *)&curName;
                UVar4 = UnicodeString::operator==(&name,(UnicodeString *)pTVar19);
                if (UVar4 != '\0') {
                  iVar9 = TimeZoneRule::getRawOffset(pTVar14);
                  iVar10 = TimeZoneRule::getRawOffset((TimeZoneRule *)local_100._vptr_UObject);
                  if (iVar9 == iVar10) {
                    iVar9 = TimeZoneRule::getDSTSavings(pTVar14);
                    iVar10 = TimeZoneRule::getDSTSavings((TimeZoneRule *)local_100._vptr_UObject);
                    if (iVar9 == iVar10) goto LAB_00202744;
                  }
                }
                if (tt < local_e0) {
                  local_e8 = pTVar14;
                  local_e0 = tt;
                }
              }
            }
          }
LAB_00202744:
        }
        if (local_e8 == (TimeZoneRule *)0x0) {
          sVar13 = 0;
          do {
            if (s == sVar13) goto LAB_002029a0;
            pcVar1 = (char *)((long)buffer + sVar13);
            sVar13 = sVar13 + 1;
          } while (*pcVar1 != '\0');
        }
        if (this->fFinalRules != (UVector *)0x0) {
          for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
            plVar15 = (long *)UVector::elementAt(this->fFinalRules,iVar8);
            pTVar19 = (TimeZoneRule *)local_100._vptr_UObject;
            cVar5 = (**(code **)(*plVar15 + 0x20))(plVar15);
            if (cVar5 == '\0') {
              pTVar14 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,iVar8);
              pTVar19 = (TimeZoneRule *)(ulong)uVar6;
              iVar11 = (*(pTVar14->super_UObject)._vptr_UObject[9])
                                 (local_f8,pTVar14,pTVar19,(ulong)uVar7,0,&tt);
              if (((char)iVar11 != '\0') && (tt < local_e0)) {
                local_e8 = pTVar14;
                local_e0 = tt;
              }
            }
          }
        }
        if (local_e8 == (TimeZoneRule *)0x0) {
LAB_002029a0:
          UnicodeString::~UnicodeString(&name);
          UnicodeString::~UnicodeString(&curName);
          pUVar16 = this->fFinalRules;
          goto LAB_002029c1;
        }
        if (this->fHistoricTransitions == (UVector *)0x0) {
          pUVar16 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)pTVar19);
          if (pUVar16 != (UVector *)0x0) {
            UVector::UVector(pUVar16,status);
          }
          this->fHistoricTransitions = pUVar16;
          if (U_ZERO_ERROR < *status) goto LAB_00202c41;
        }
        obj = (double *)uprv_malloc_63(0x18);
        if (obj != (double *)0x0) {
          *obj = local_e0;
          obj[1] = (double)local_100._vptr_UObject;
          obj[2] = (double)local_e8;
          UVector::addElement(this->fHistoricTransitions,obj,status);
          if (U_ZERO_ERROR < *status) goto LAB_00202c41;
          UnicodeString::~UnicodeString(&name);
          UnicodeString::~UnicodeString(&curName);
          local_f8 = local_e0;
          local_100._vptr_UObject = (_func_int **)local_e8;
          goto LAB_002026cc;
        }
        *status = U_MEMORY_ALLOCATION_ERROR;
LAB_00202c41:
        UnicodeString::~UnicodeString(&name);
        UnicodeString::~UnicodeString(&curName);
      }
      goto LAB_00202b7d;
    }
    buffer = (void *)0x0;
    local_f8 = -1.84303902528e+17;
LAB_002029c1:
    if (pUVar16 == (UVector *)0x0) goto LAB_002029c6;
  }
  else {
    if (pUVar16->count != 2) {
      *status = U_INVALID_STATE_ERROR;
      return;
    }
    local_100._vptr_UObject = (_func_int **)this->fInitialRule;
    pUVar12 = this->fHistoricRules;
    if (pUVar12 != (UVector *)0x0) goto LAB_00202662;
    buffer = (void *)0x0;
    local_f8 = -1.84303902528e+17;
  }
  if (this->fHistoricTransitions == (UVector *)0x0) {
    pUVar16 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)pTVar19);
    if (pUVar16 != (UVector *)0x0) {
      UVector::UVector(pUVar16,status);
    }
    this->fHistoricTransitions = pUVar16;
    if (U_ZERO_ERROR < *status) goto LAB_00202b7d;
    pUVar16 = this->fFinalRules;
  }
  this_00._vptr_UObject = (_func_int **)UVector::elementAt(pUVar16,0);
  this_01._vptr_UObject = (_func_int **)UVector::elementAt(this->fFinalRules,1);
  uVar6 = TimeZoneRule::getRawOffset((TimeZoneRule *)local_100._vptr_UObject);
  uVar7 = TimeZoneRule::getDSTSavings((TimeZoneRule *)local_100._vptr_UObject);
  iVar8 = (**(_func_int **)((long)*this_00._vptr_UObject + 0x48))
                    (local_f8,this_00._vptr_UObject,(ulong)uVar6,(ulong)uVar7,0,&curName);
  uVar6 = TimeZoneRule::getRawOffset((TimeZoneRule *)local_100._vptr_UObject);
  uVar7 = TimeZoneRule::getDSTSavings((TimeZoneRule *)local_100._vptr_UObject);
  iVar11 = (**(_func_int **)((long)*this_01._vptr_UObject + 0x48))
                     (local_f8,this_01._vptr_UObject,(ulong)uVar6,(ulong)uVar7,0,&name);
  UVar18 = U_INVALID_STATE_ERROR;
  if (((char)iVar8 != '\0') && ((char)iVar11 != '\0')) {
    buffer_00 = (UObject *)uprv_malloc_63(0x18);
    UVar18 = U_MEMORY_ALLOCATION_ERROR;
    if (buffer_00 != (UObject *)0x0) {
      obj_00 = uprv_malloc_63(0x18);
      RVar3 = name.super_Replaceable;
      RVar2 = curName.super_Replaceable;
      if (obj_00 != (void *)0x0) {
        if ((double)name.super_Replaceable.super_UObject._vptr_UObject <=
            (double)curName.super_Replaceable.super_UObject._vptr_UObject) {
          buffer_00->_vptr_UObject =
               (_func_int **)name.super_Replaceable.super_UObject._vptr_UObject;
          buffer_00[1]._vptr_UObject = local_100._vptr_UObject;
          buffer_00[2]._vptr_UObject = this_01._vptr_UObject;
          uVar6 = TimeZoneRule::getRawOffset((TimeZoneRule *)this_01._vptr_UObject);
          uVar7 = TimeZoneRule::getDSTSavings((TimeZoneRule *)this_01._vptr_UObject);
          (**(_func_int **)((long)*this_00._vptr_UObject + 0x48))
                    (RVar3.super_UObject._vptr_UObject,this_00._vptr_UObject,(ulong)uVar6,
                     (ulong)uVar7,0,obj_00);
          UVar17._vptr_UObject = this_01._vptr_UObject;
        }
        else {
          buffer_00->_vptr_UObject =
               (_func_int **)curName.super_Replaceable.super_UObject._vptr_UObject;
          buffer_00[1]._vptr_UObject = local_100._vptr_UObject;
          buffer_00[2]._vptr_UObject = this_00._vptr_UObject;
          uVar6 = TimeZoneRule::getRawOffset((TimeZoneRule *)this_00._vptr_UObject);
          uVar7 = TimeZoneRule::getDSTSavings((TimeZoneRule *)this_00._vptr_UObject);
          (**(_func_int **)((long)*this_01._vptr_UObject + 0x48))
                    (RVar2.super_UObject._vptr_UObject,this_01._vptr_UObject,(ulong)uVar6,
                     (ulong)uVar7,0,obj_00);
          UVar17._vptr_UObject = this_00._vptr_UObject;
          this_00._vptr_UObject = this_01._vptr_UObject;
        }
        *(_func_int ***)((long)obj_00 + 8) = UVar17._vptr_UObject;
        *(_func_int ***)((long)obj_00 + 0x10) = this_00._vptr_UObject;
        UVector::addElement(this->fHistoricTransitions,buffer_00,status);
        if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
           (UVector::addElement(this->fHistoricTransitions,obj_00,status),
           *status < U_ILLEGAL_ARGUMENT_ERROR)) {
LAB_002029c6:
          this->fUpToDate = '\x01';
          if (buffer == (void *)0x0) {
            return;
          }
          uprv_free_63(buffer);
          return;
        }
        goto LAB_00202b7d;
      }
      uprv_free_63(buffer_00);
    }
  }
  *status = UVar18;
LAB_00202b7d:
  deleteTransitions(this);
  if (buffer != (void *)0x0) {
    uprv_free_63(buffer);
  }
  this->fUpToDate = '\0';
  return;
}

Assistant:

TimeZoneRule*
RuleBasedTimeZone::findRuleInFinal(UDate date, UBool local,
                                   int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt) const {
    if (fFinalRules == NULL) {
        return NULL;
    }

    AnnualTimeZoneRule* fr0 = (AnnualTimeZoneRule*)fFinalRules->elementAt(0);
    AnnualTimeZoneRule* fr1 = (AnnualTimeZoneRule*)fFinalRules->elementAt(1);
    if (fr0 == NULL || fr1 == NULL) {
        return NULL;
    }

    UDate start0, start1;
    UDate base;
    int32_t localDelta;

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr1->getRawOffset(), fr1->getDSTSavings(),
                                   fr0->getRawOffset(), fr0->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail0 = fr0->getPreviousStart(base, fr1->getRawOffset(), fr1->getDSTSavings(), TRUE, start0);

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr0->getRawOffset(), fr0->getDSTSavings(),
                                   fr1->getRawOffset(), fr1->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail1 = fr1->getPreviousStart(base, fr0->getRawOffset(), fr0->getDSTSavings(), TRUE, start1);

    if (!avail0 || !avail1) {
        if (avail0) {
            return fr0;
        } else if (avail1) {
            return fr1;
        }
        // Both rules take effect after the given time
        return NULL;
    }

    return (start0 > start1) ? fr0 : fr1;
}